

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeAdapter.cpp
# Opt level: O0

void __thiscall
OpenMD::FluctuatingChargeAdapter::makeFluctuatingCharge
          (FluctuatingChargeAdapter *this,RealType chargeMass,RealType nValence,RealType nMobile,
          DoublePolynomial *vs)

{
  bool bVar1;
  FluctuatingAtypeParameters *in_RDI;
  FluctuatingAtypeParameters fqParam;
  string *in_stack_ffffffffffffff08;
  AtomType *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  shared_ptr<OpenMD::GenericData> local_b8 [2];
  undefined8 local_98;
  undefined1 local_90;
  undefined1 local_8f;
  undefined8 local_88;
  undefined8 local_80;
  shared_ptr<OpenMD::GenericData> *genData;
  AtomType *this_00;
  
  bVar1 = isFluctuatingCharge((FluctuatingChargeAdapter *)0x365119);
  if (bVar1) {
    AtomType::removeProperty(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  local_98 = 0;
  local_90 = 0;
  local_8f = 0;
  local_88 = 0;
  local_80 = 0;
  genData = (shared_ptr<OpenMD::GenericData> *)0x0;
  this_00 = (AtomType *)0x0;
  Polynomial<double>::Polynomial((Polynomial<double> *)0x365199);
  local_8f = 0;
  local_90 = 1;
  Polynomial<double>::operator=
            ((Polynomial<double> *)in_stack_ffffffffffffff10,
             (Polynomial<double> *)in_stack_ffffffffffffff08);
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>,std::__cxx11::string_const&,OpenMD::FluctuatingAtypeParameters&>
            (in_stack_ffffffffffffff38,in_RDI);
  std::shared_ptr<OpenMD::GenericData>::
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>,void>
            (local_b8,(shared_ptr<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>_> *)
                      in_stack_ffffffffffffff08);
  AtomType::addProperty(this_00,genData);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x365235);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>_> *)0x36523f);
  FluctuatingAtypeParameters::~FluctuatingAtypeParameters((FluctuatingAtypeParameters *)0x365249);
  return;
}

Assistant:

void FluctuatingChargeAdapter::makeFluctuatingCharge(RealType chargeMass,
                                                       RealType nValence,
                                                       RealType nMobile,
                                                       DoublePolynomial vs) {
    if (isFluctuatingCharge()) { at_->removeProperty(FQtypeID); }

    FluctuatingAtypeParameters fqParam {};

    fqParam.chargeMass               = chargeMass;
    fqParam.usesSlaterIntramolecular = false;
    fqParam.isMetallic               = true;
    fqParam.nValence                 = nValence;
    fqParam.nMobile                  = nMobile;

    fqParam.vself = vs;

    at_->addProperty(std::make_shared<FluctuatingAtypeData>(FQtypeID, fqParam));
  }